

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::InternalSwap
          (CodeGeneratorResponse *this,CodeGeneratorResponse *other)

{
  Arena *rhs_arena_00;
  Arena *lhs_arena_00;
  uint32_t *__a;
  uint32_t *__b;
  string *default_value;
  Arena *rhs_arena;
  Arena *lhs_arena;
  CodeGeneratorResponse *other_local;
  CodeGeneratorResponse *this_local;
  
  rhs_arena_00 = MessageLite::GetArenaForAllocation((MessageLite *)this);
  lhs_arena_00 = MessageLite::GetArenaForAllocation((MessageLite *)other);
  internal::InternalMetadata::InternalSwap
            (&(this->super_Message).super_MessageLite._internal_metadata_,
             &(other->super_Message).super_MessageLite._internal_metadata_);
  __a = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  __b = internal::HasBits<1UL>::operator[](&other->_has_bits_,0);
  std::swap<unsigned_int>(__a,__b);
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::InternalSwap
            (&this->file_,&other->file_);
  default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::InternalSwap
            (default_value,&this->error_,rhs_arena_00,&other->error_,lhs_arena_00);
  std::swap<unsigned_long>(&this->supported_features_,&other->supported_features_);
  return;
}

Assistant:

void CodeGeneratorResponse::InternalSwap(CodeGeneratorResponse* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  file_.InternalSwap(&other->file_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &error_, lhs_arena,
      &other->error_, rhs_arena
  );
  swap(supported_features_, other->supported_features_);
}